

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::Group::Group(Group *this,Group *group_,string *help_,
                  function<bool_(const_args::Group_&)> *validator_)

{
  Group *in_RDI;
  string *in_stack_ffffffffffffffb8;
  Base *child;
  function<bool_(const_args::Group_&)> *in_stack_ffffffffffffffd0;
  
  Base::Base(&in_RDI->super_Base,in_stack_ffffffffffffffb8);
  (in_RDI->super_Base)._vptr_Base = (_func_int **)&PTR__Group_0019b688;
  child = (Base *)&in_RDI->children;
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::vector
            ((vector<args::Base_*,_std::allocator<args::Base_*>_> *)0x1153d8);
  std::function<bool_(const_args::Group_&)>::function(in_stack_ffffffffffffffd0,&in_RDI->validator);
  Add(in_RDI,child);
  return;
}

Assistant:

Group(Group &group_, const std::string &help_ = std::string(), const std::function<bool(const Group &)> &validator_ = Validators::DontCare) : Base(help_), validator(validator_)
            {
                group_.Add(*this);
            }